

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

bool __thiscall QGles2ShaderResourceBindings::create(QGles2ShaderResourceBindings *this)

{
  QRhiImplementation *this_00;
  void *pvVar1;
  bool bVar2;
  long lVar3;
  
  this_00 = (this->super_QRhiShaderResourceBindings).super_QRhiResource.m_rhi;
  bVar2 = QRhiImplementation::sanityCheckShaderResourceBindings
                    (this_00,&this->super_QRhiShaderResourceBindings);
  if (bVar2) {
    this->hasDynamicOffset = false;
    pvVar1 = (this->super_QRhiShaderResourceBindings).m_bindings.
             super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.ptr;
    for (lVar3 = 0;
        (ulong)(uint)(this->super_QRhiShaderResourceBindings).m_bindings.
                     super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.s * 0x118 - lVar3
        != 0; lVar3 = lVar3 + 0x118) {
      if ((*(int *)((long)pvVar1 + lVar3 + 8) == 0) &&
         (*(char *)((long)pvVar1 + lVar3 + 0x20) == '\x01')) {
        this->hasDynamicOffset = true;
        break;
      }
    }
    QRhiImplementation::updateLayoutDesc(this_00,&this->super_QRhiShaderResourceBindings);
    this->generation = this->generation + 1;
    QRhiImplementation::registerResource(this_00,(QRhiResource *)this,false);
  }
  return bVar2;
}

Assistant:

bool QGles2ShaderResourceBindings::create()
{
    QRHI_RES_RHI(QRhiGles2);
    if (!rhiD->sanityCheckShaderResourceBindings(this))
        return false;

    hasDynamicOffset = false;
    for (int i = 0, ie = m_bindings.size(); i != ie; ++i) {
        const QRhiShaderResourceBinding::Data *b = QRhiImplementation::shaderResourceBindingData(m_bindings.at(i));
        if (b->type == QRhiShaderResourceBinding::UniformBuffer) {
            if (b->u.ubuf.hasDynamicOffset) {
                hasDynamicOffset = true;
                break;
            }
        }
    }

    rhiD->updateLayoutDesc(this);

    generation += 1;
    rhiD->registerResource(this, false);
    return true;
}